

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O1

void __thiscall cmCPackGeneratorFactory::cmCPackGeneratorFactory(cmCPackGeneratorFactory *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_40;
  
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackGeneratorFactory_0060f3b0;
  (this->Generators).super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Generators).super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Generators).super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header;
  (this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GeneratorCreators)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header;
  (this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GeneratorDescriptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TGZ","");
  RegisterGenerator(this,&local_40,"Tar GZip compression",cmCPackTGZGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TXZ","");
  RegisterGenerator(this,&local_40,"Tar XZ compression",cmCPackTXZGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"STGZ","");
  RegisterGenerator(this,&local_40,"Self extracting Tar GZip compression",
                    cmCPackSTGZGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NSIS","");
  RegisterGenerator(this,&local_40,"Null Soft Installer",cmCPackNSISGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NSIS64","");
  RegisterGenerator(this,&local_40,"Null Soft Installer (64-bit)",
                    cmCPackNSISGenerator::CreateGenerator64);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"IFW","");
  RegisterGenerator(this,&local_40,"Qt Installer Framework",cmCPackIFWGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ZIP","");
  RegisterGenerator(this,&local_40,"ZIP file format",cmCPackZIPGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"7Z","");
  RegisterGenerator(this,&local_40,"7-Zip file format",cmCPack7zGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TBZ2","");
  RegisterGenerator(this,&local_40,"Tar BZip2 compression",cmCPackTarBZip2Generator::CreateGenerator
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TZ","");
  RegisterGenerator(this,&local_40,"Tar Compress compression",
                    cmCPackTarCompressGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DEB","");
  RegisterGenerator(this,&local_40,"Debian packages",cmCPackDebGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"RPM","");
  RegisterGenerator(this,&local_40,"RPM packages",cmCPackRPMGenerator::CreateGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCPackGeneratorFactory::cmCPackGeneratorFactory()
{
  if (cmCPackTGZGenerator::CanGenerate())
    {
    this->RegisterGenerator("TGZ", "Tar GZip compression",
      cmCPackTGZGenerator::CreateGenerator);
    }
  if (cmCPackTXZGenerator::CanGenerate())
    {
    this->RegisterGenerator("TXZ", "Tar XZ compression",
      cmCPackTXZGenerator::CreateGenerator);
    }
  if (cmCPackSTGZGenerator::CanGenerate())
    {
    this->RegisterGenerator("STGZ", "Self extracting Tar GZip compression",
      cmCPackSTGZGenerator::CreateGenerator);
    }
  if (cmCPackNSISGenerator::CanGenerate())
    {
    this->RegisterGenerator("NSIS", "Null Soft Installer",
      cmCPackNSISGenerator::CreateGenerator);
    this->RegisterGenerator("NSIS64", "Null Soft Installer (64-bit)",
      cmCPackNSISGenerator::CreateGenerator64);
    }
  if (cmCPackIFWGenerator::CanGenerate())
    {
    this->RegisterGenerator("IFW", "Qt Installer Framework",
      cmCPackIFWGenerator::CreateGenerator);
    }
#ifdef __CYGWIN__
  if (cmCPackCygwinBinaryGenerator::CanGenerate())
    {
    this->RegisterGenerator("CygwinBinary", "Cygwin Binary Installer",
                            cmCPackCygwinBinaryGenerator::CreateGenerator);
    }
  if (cmCPackCygwinSourceGenerator::CanGenerate())
    {
    this->RegisterGenerator("CygwinSource", "Cygwin Source Installer",
                            cmCPackCygwinSourceGenerator::CreateGenerator);
    }
#endif

  if (cmCPackZIPGenerator::CanGenerate())
    {
    this->RegisterGenerator("ZIP", "ZIP file format",
      cmCPackZIPGenerator::CreateGenerator);
    }
  if (cmCPack7zGenerator::CanGenerate())
    {
    this->RegisterGenerator("7Z", "7-Zip file format",
      cmCPack7zGenerator::CreateGenerator);
    }
#ifdef _WIN32
  if (cmCPackWIXGenerator::CanGenerate())
    {
    this->RegisterGenerator("WIX", "MSI file format via WiX tools",
      cmCPackWIXGenerator::CreateGenerator);
    }
#endif
  if (cmCPackTarBZip2Generator::CanGenerate())
    {
    this->RegisterGenerator("TBZ2", "Tar BZip2 compression",
      cmCPackTarBZip2Generator::CreateGenerator);
    }
  if (cmCPackTarCompressGenerator::CanGenerate())
    {
    this->RegisterGenerator("TZ", "Tar Compress compression",
      cmCPackTarCompressGenerator::CreateGenerator);
    }
#ifdef __APPLE__
  if (cmCPackDragNDropGenerator::CanGenerate())
    {
    this->RegisterGenerator("DragNDrop", "Mac OSX Drag And Drop",
      cmCPackDragNDropGenerator::CreateGenerator);
    }
  if (cmCPackBundleGenerator::CanGenerate())
    {
    this->RegisterGenerator("Bundle", "Mac OSX bundle",
      cmCPackBundleGenerator::CreateGenerator);
    }
  if (cmCPackPackageMakerGenerator::CanGenerate())
    {
    this->RegisterGenerator("PackageMaker", "Mac OSX Package Maker installer",
      cmCPackPackageMakerGenerator::CreateGenerator);
    }
  if (cmCPackOSXX11Generator::CanGenerate())
    {
    this->RegisterGenerator("OSXX11", "Mac OSX X11 bundle",
      cmCPackOSXX11Generator::CreateGenerator);
    }
#endif
#if !defined(_WIN32) \
  && !defined(__QNXNTO__) && !defined(__BEOS__) && !defined(__HAIKU__)
  if (cmCPackDebGenerator::CanGenerate())
    {
    this->RegisterGenerator("DEB", "Debian packages",
      cmCPackDebGenerator::CreateGenerator);
    }
  if (cmCPackRPMGenerator::CanGenerate())
    {
    this->RegisterGenerator("RPM", "RPM packages",
      cmCPackRPMGenerator::CreateGenerator);
    }
#endif
}